

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O1

void __thiscall Pl_Base64::encode(Pl_Base64 *this,uchar *data,size_t len)

{
  uchar uVar1;
  size_t sVar2;
  uchar *p;
  size_t sVar3;
  
  if (len != 0) {
    sVar3 = 0;
    do {
      uVar1 = data[sVar3];
      sVar2 = this->pos;
      this->pos = sVar2 + 1;
      this->buf[sVar2] = uVar1;
      if (this->pos == 3) {
        flush(this);
      }
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  return;
}

Assistant:

void
Pl_Base64::encode(unsigned char const* data, size_t len)
{
    unsigned char const* p = data;
    while (len > 0) {
        this->buf[this->pos++] = *p;
        if (this->pos == 3) {
            flush();
        }
        ++p;
        --len;
    }
}